

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::
getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,VaryingLocationAliasingWithMixedInterpolationTest *this,
          GLuint test_case_index)

{
  pointer ptVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  VaryingLocationAliasingWithMixedInterpolationTest *pVVar4;
  char *pcVar5;
  stringstream stream;
  stringstream local_1b0 [16];
  ostream local_1a0;
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(&local_1a0,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  pVVar4 = (VaryingLocationAliasingWithMixedInterpolationTest *)std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<((ostream *)pVVar4,", ");
  pGVar3 = getInterpolationQualifier(pVVar4,ptVar1[test_case_index].m_interpolation_gohan);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type_gohan);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," at ");
  pVVar4 = (VaryingLocationAliasingWithMixedInterpolationTest *)
           std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<((ostream *)pVVar4,", ");
  pGVar3 = getInterpolationQualifier(pVVar4,ptVar1[test_case_index].m_interpolation_goten);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," ");
  pGVar3 = Utils::Type::GetGLSLTypeName(&ptVar1[test_case_index].m_type_goten);
  poVar2 = std::operator<<(poVar2,pGVar3);
  poVar2 = std::operator<<(poVar2," at ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,". Direction: ");
  pcVar5 = "output";
  if (ptVar1[test_case_index].m_is_input != false) {
    pcVar5 = "input";
  }
  std::operator<<(&local_1a0,pcVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string VaryingLocationAliasingWithMixedInterpolationTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", "
		   << getInterpolationQualifier(test_case.m_interpolation_gohan) << " "
		   << test_case.m_type_gohan.GetGLSLTypeName() << " at " << test_case.m_component_gohan << ", "
		   << getInterpolationQualifier(test_case.m_interpolation_goten) << " "
		   << test_case.m_type_goten.GetGLSLTypeName() << " at " << test_case.m_component_goten << ". Direction: ";

	if (true == test_case.m_is_input)
	{
		stream << "input";
	}
	else
	{
		stream << "output";
	}

	return stream.str();
}